

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::needHeartbeat(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  
  iVar1 = operator-(&now->super_DateTime,&(this->m_lastSentTime).super_DateTime);
  iVar2 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  return this->m_testRequest == 0 && iVar2 <= iVar1;
}

Assistant:

bool needHeartbeat(const UtcTimeStamp &now) const {
    return ((now - lastSentTime()) >= heartBtInt()) && !testRequest();
  }